

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printDot(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  char *s;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar1);
  emit(this,'.');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  s = Value::getCString((Value *)*puVar1);
  emit(this,s);
  return;
}

Assistant:

void printDot(Ref node) {
    print(node[1]);
    emit('.');
    emit(node[2]->getCString());
  }